

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

pair<bool,_unsigned_long> __thiscall
LiteralTokenizerRule::tryMatch(LiteralTokenizerRule *this,shared_ptr<Readable> *reader)

{
  char cVar1;
  element_type *peVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined8 uVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  pair<bool,_unsigned_long> pVar9;
  
  if ((this->literal)._M_string_length == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    do {
      cVar1 = (this->literal)._M_dataplus._M_p[uVar6];
      peVar2 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (*peVar2->_vptr_Readable[2])(peVar2,uVar6);
      in_RAX = CONCAT44(extraout_var,iVar3);
      if (cVar1 != (char)iVar3) goto LAB_0011321c;
      uVar6 = uVar6 + 1;
      uVar5 = (this->literal)._M_string_length;
    } while (uVar6 < uVar5);
  }
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (this->nextCharMustBeNonAlpha == true) {
    peVar2 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = (*peVar2->_vptr_Readable[2])(peVar2,uVar5);
    cVar1 = (char)iVar3;
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
LAB_0011321c:
      uVar4 = 0;
    }
    else {
      bVar7 = (byte)(cVar1 + 0xa5U) < 0xe6;
      bVar8 = (byte)(cVar1 - 0x3aU) < 0xf6;
      uVar4 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar3) >> 8),(bVar8 && bVar7) && cVar1 != '_'
                      );
      if ((bVar8 && bVar7) && cVar1 != '_') {
        uVar5 = (this->literal)._M_string_length;
        goto LAB_00113220;
      }
    }
    uVar5 = 0;
  }
LAB_00113220:
  pVar9.second = uVar5;
  pVar9._0_8_ = uVar4;
  return pVar9;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    for (std::size_t i = 0; i < this->literal.length(); i++) {
      if (this->literal.at(i) != reader->charAt(i)) {
        return std::make_pair(false, 0);
      }
    }

    if (this->nextCharMustBeNonAlpha && isLiteralRest(reader->charAt(this->literal.size()))) {
      return std::make_pair(false, 0);
    }

    return std::make_pair(true, this->literal.length());
  }